

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.cpp
# Opt level: O3

void __thiscall Cache::PLRUUpdate(Cache *this,uint32_t block_id)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  
  uVar2 = (this->policy).associativity;
  if (1 < uVar2) {
    uVar4 = (ulong)block_id % (ulong)uVar2;
    piVar1 = this->plru_bit[(ulong)block_id / (ulong)uVar2];
    uVar2 = 1;
    do {
      uVar5 = (int)(uVar4 >> 0x1f) + (int)uVar4;
      iVar3 = (int)uVar4 - (uVar5 & 0xfffffffe);
      piVar1[(int)uVar2] = (uint)(iVar3 == 0);
      uVar2 = iVar3 + uVar2 * 2;
      uVar4 = (ulong)(uint)((int)uVar5 >> 1);
    } while (uVar2 < (this->policy).associativity);
  }
  return;
}

Assistant:

void Cache::PLRUUpdate(uint32_t block_id) {
    uint32_t set_id = block_id / this->policy.associativity;
    uint32_t id2 = block_id % this->policy.associativity;
    int node, tmp;
    for (node = 1, tmp = id2; node < this->policy.associativity;) {
        plru_bit[set_id][node] = tmp % 2 == 0 ? 1 : 0;
        node = node * 2 + tmp % 2;
        tmp /= 2;
    }
}